

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

int uv__check_before_write(uv_stream_t *stream,uint nbufs,uv_stream_t *send_handle)

{
  int iVar1;
  uv_stream_t *send_handle_local;
  uint nbufs_local;
  uv_stream_t *stream_local;
  
  if (nbufs == 0) {
    __assert_fail("nbufs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/stream.c"
                  ,0x57e,"int uv__check_before_write(uv_stream_t *, unsigned int, uv_stream_t *)");
  }
  if (((stream->type != UV_TCP) && (stream->type != UV_NAMED_PIPE)) && (stream->type != UV_TTY)) {
    __assert_fail("(stream->type == UV_TCP || stream->type == UV_NAMED_PIPE || stream->type == UV_TTY) && \"uv_write (unix) does not yet support other types of streams\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/stream.c"
                  ,0x582,"int uv__check_before_write(uv_stream_t *, unsigned int, uv_stream_t *)");
  }
  if ((stream->io_watcher).fd < 0) {
    stream_local._4_4_ = -9;
  }
  else if ((stream->flags & 0x8000) == 0) {
    stream_local._4_4_ = -0x20;
  }
  else {
    if (send_handle != (uv_stream_t *)0x0) {
      if ((stream->type != UV_NAMED_PIPE) || (*(int *)&stream[1].data == 0)) {
        return -0x16;
      }
      iVar1 = uv__handle_fd((uv_handle_t *)send_handle);
      if (iVar1 < 0) {
        return -9;
      }
    }
    stream_local._4_4_ = 0;
  }
  return stream_local._4_4_;
}

Assistant:

static int uv__check_before_write(uv_stream_t* stream,
                                  unsigned int nbufs,
                                  uv_stream_t* send_handle) {
  assert(nbufs > 0);
  assert((stream->type == UV_TCP ||
          stream->type == UV_NAMED_PIPE ||
          stream->type == UV_TTY) &&
         "uv_write (unix) does not yet support other types of streams");

  if (uv__stream_fd(stream) < 0)
    return UV_EBADF;

  if (!(stream->flags & UV_HANDLE_WRITABLE))
    return UV_EPIPE;

  if (send_handle != NULL) {
    if (stream->type != UV_NAMED_PIPE || !((uv_pipe_t*)stream)->ipc)
      return UV_EINVAL;

    /* XXX We abuse uv_write2() to send over UDP handles to child processes.
     * Don't call uv__stream_fd() on those handles, it's a macro that on OS X
     * evaluates to a function that operates on a uv_stream_t with a couple of
     * OS X specific fields. On other Unices it does (handle)->io_watcher.fd,
     * which works but only by accident.
     */
    if (uv__handle_fd((uv_handle_t*) send_handle) < 0)
      return UV_EBADF;

#if defined(__CYGWIN__) || defined(__MSYS__)
    /* Cygwin recvmsg always sets msg_controllen to zero, so we cannot send it.
       See https://github.com/mirror/newlib-cygwin/blob/86fc4bf0/winsup/cygwin/fhandler_socket.cc#L1736-L1743 */
    return UV_ENOSYS;
#endif
  }

  return 0;
}